

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdpc.c
# Opt level: O2

void hdpc_generate_mat_faster(m256v *H,parameters *P)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  int j;
  long lVar5;
  int i_1;
  uint uVar6;
  m256v G_HDPC;
  m256v I_H;
  
  lVar5 = 0;
  m256v_get_subview(&G_HDPC,H,0,0,P->H,P->S + P->Kprime);
  uVar1 = '\x01';
  while( true ) {
    if (P->H <= lVar5) break;
    G_HDPC.e[(long)(P->S + P->Kprime) + -1 + G_HDPC.rstride * lVar5] = uVar1;
    uVar1 = gf256_mul(uVar1,'\x02');
    lVar5 = lVar5 + 1;
  }
  for (uVar6 = (P->Kprime + P->S) - 2; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
    uVar4 = (ulong)uVar6;
    for (lVar5 = 0; lVar5 < P->H; lVar5 = lVar5 + 1) {
      uVar1 = gf256_mul('\x02',G_HDPC.e[uVar4 + 1 + G_HDPC.rstride * lVar5]);
      G_HDPC.e[uVar4 + G_HDPC.rstride * lVar5] = uVar1;
    }
    uVar2 = Rand(uVar6 + 1,6,P->H);
    uVar1 = gf256_add('\x01',G_HDPC.e[uVar4 + G_HDPC.rstride * (long)(int)uVar2]);
    G_HDPC.e[uVar4 + G_HDPC.rstride * (long)(int)uVar2] = uVar1;
    uVar3 = Rand(uVar6 + 1,7,P->H + -1);
    lVar5 = (long)(int)((uVar3 + uVar2 + 1) % (uint)P->H);
    uVar1 = gf256_add('\x01',G_HDPC.e[uVar4 + G_HDPC.rstride * lVar5]);
    G_HDPC.e[uVar4 + lVar5 * G_HDPC.rstride] = uVar1;
  }
  m256v_get_subview(&I_H,H,0,P->S + P->Kprime,P->H,P->H);
  m256v_clear(&I_H);
  for (lVar5 = 0; lVar5 < P->H; lVar5 = lVar5 + 1) {
    I_H.e[lVar5 + I_H.rstride * lVar5] = '\x01';
  }
  return;
}

Assistant:

void hdpc_generate_mat_faster(m256v* H, const parameters* P)
{
	assert(H->n_row == P->H);
	assert(H->n_col == P->L);

	/* Create G_HDPC */
	m256v G_HDPC = m256v_get_subview(H, 0, 0, P->H, P->Kprime + P->S);
	uint8_t val = 1;
	for (int j = 0; j < P->H; ++j) {
		m256v_set_el(&G_HDPC, j, P->Kprime + P->S - 1, val);
		val = gf256_mul(val, 2);
	}
	for (int j = P->Kprime + P->S - 2; j >= 0; --j) {
		/* Copy over previous column, multiplied by alpha */
		for (int i = 0; i < P->H; ++i) {
			m256v_set_el(&G_HDPC, i, j,
			  gf256_mul(2, m256v_get_el(&G_HDPC, i, j + 1)));
		}

		/* Add in the two flipped positions */
		int a = Rand(j + 1, 6, P->H);
		m256v_set_el(&G_HDPC, a, j,
		  gf256_add(1, m256v_get_el(&G_HDPC, a, j)));
		a = (a + Rand(j + 1, 7, P->H - 1) + 1) % P->H;
		m256v_set_el(&G_HDPC, a, j,
		  gf256_add(1, m256v_get_el(&G_HDPC, a, j)));
	}

	/* Create I_H */
	m256v I_H = m256v_get_subview(H, 0, P->Kprime + P->S, P->H, P->H);
	m256v_clear(&I_H);
	for (int i = 0; i < P->H; ++i) {
		m256v_set_el(&I_H, i, i, 1);
	}
}